

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdSchnorrKeyPairTweakAdd
              (void *handle,char *privkey,char *tweak,char **tweaked_pubkey,bool *tweaked_parity,
              char **tweaked_privkey)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 *in_RCX;
  char *in_RDX;
  char *in_RSI;
  bool *in_R8;
  undefined8 *in_R9;
  CfdException *except;
  exception *std_except;
  SchnorrPubkey schnorr_pubkey;
  Privkey tweaked_privkey_obj;
  Privkey privkey_obj;
  ByteData256 tweak_obj;
  char *work_privkey;
  char *work_pubkey;
  int result;
  string *in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffe00;
  allocator *paVar3;
  string local_1e0;
  string local_1c0;
  SchnorrPubkey local_1a0;
  Privkey local_188;
  allocator local_161;
  string local_160;
  Privkey local_140;
  allocator local_119;
  string local_118;
  ByteData256 local_f8;
  undefined1 local_da;
  allocator local_d9;
  string local_d8 [32];
  CfdSourceLocation local_b8;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [32];
  CfdSourceLocation local_78;
  char *local_50;
  char *local_48;
  undefined4 local_3c;
  undefined8 *local_38;
  bool *local_30;
  undefined8 *local_28;
  char *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  local_3c = 0xffffffff;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_78.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_78.filename = local_78.filename + 1;
    local_78.line = 0x212;
    local_78.funcname = "CfdSchnorrKeyPairTweakAdd";
    cfd::core::logger::warn<>(&local_78,"privkey is null or empty.");
    local_9a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar3 = &local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"Failed to parameter. privkey is null or empty.",paVar3);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffdc0,error_code,in_stack_fffffffffffffdb0);
    local_9a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_118,local_20,&local_119);
    cfd::core::ByteData256::ByteData256(&local_f8,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_160,local_18,&local_161);
    cfd::core::Privkey::Privkey(&local_140,&local_160,kMainnet,true);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    cfd::core::Privkey::Privkey(&local_188);
    cfd::core::SchnorrPubkey::CreateTweakAddFromPrivkey
              (&local_1a0,&local_140,&local_f8,&local_188,local_30);
    if (local_28 != (undefined8 *)0x0) {
      cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_1c0,&local_1a0);
      local_48 = cfd::capi::CreateString(in_stack_fffffffffffffe00);
      std::__cxx11::string::~string((string *)&local_1c0);
    }
    if (local_38 != (undefined8 *)0x0) {
      cfd::core::Privkey::GetHex_abi_cxx11_(&local_1e0,&local_188);
      local_50 = cfd::capi::CreateString(in_stack_fffffffffffffe00);
      std::__cxx11::string::~string((string *)&local_1e0);
    }
    if (local_28 != (undefined8 *)0x0) {
      *local_28 = local_48;
    }
    if (local_38 != (undefined8 *)0x0) {
      *local_38 = local_50;
    }
    local_4 = 0;
    cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x5cf7f3);
    cfd::core::Privkey::~Privkey((Privkey *)0x5cf800);
    cfd::core::Privkey::~Privkey((Privkey *)0x5cf80d);
    cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5cf81a);
    return local_4;
  }
  local_b8.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
               ,0x2f);
  local_b8.filename = local_b8.filename + 1;
  local_b8.line = 0x218;
  local_b8.funcname = "CfdSchnorrKeyPairTweakAdd";
  cfd::core::logger::warn<>(&local_b8,"tweak is null or empty.");
  local_da = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"Failed to parameter. tweak is null or empty.",&local_d9);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffdc0,error_code,in_stack_fffffffffffffdb0);
  local_da = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSchnorrKeyPairTweakAdd(
    void* handle, const char* privkey, const char* tweak,
    char** tweaked_pubkey, bool* tweaked_parity, char** tweaked_privkey) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_pubkey = nullptr;
  char* work_privkey = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(privkey)) {
      warn(CFD_LOG_SOURCE, "privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null or empty.");
    }
    if (IsEmptyString(tweak)) {
      warn(CFD_LOG_SOURCE, "tweak is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tweak is null or empty.");
    }

    ByteData256 tweak_obj = ByteData256(std::string(tweak));
    Privkey privkey_obj = Privkey(std::string(privkey));
    Privkey tweaked_privkey_obj;
    SchnorrPubkey schnorr_pubkey = SchnorrPubkey::CreateTweakAddFromPrivkey(
        privkey_obj, tweak_obj, &tweaked_privkey_obj, tweaked_parity);
    if (tweaked_pubkey != nullptr) {
      work_pubkey = CreateString(schnorr_pubkey.GetHex());
    }
    if (tweaked_privkey != nullptr) {
      work_privkey = CreateString(tweaked_privkey_obj.GetHex());
    }

    if (tweaked_pubkey != nullptr) *tweaked_pubkey = work_pubkey;
    if (tweaked_privkey != nullptr) *tweaked_privkey = work_privkey;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_pubkey, &work_privkey);
  return result;
}